

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

uint PrintStackFrame(int address,char *current,uint bufSize,bool withVariables)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ExternFuncInfo *pEVar6;
  ExternSourceInfo *pEVar7;
  char *pcVar8;
  ExternTypeInfo *pEVar9;
  ExternLocalInfo *pEVar10;
  ExternVarInfo *pEVar11;
  int iVar12;
  undefined7 in_register_00000009;
  int *piVar13;
  char *pcVar14;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  uint *puVar18;
  uint uVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  uint exLocalsSize;
  ExternFuncInfo *local_60;
  ExternTypeInfo *local_58;
  char *local_50;
  uint exInfoSize;
  uint exModulesSize;
  ExternModuleInfo *local_40;
  uint exTypesSize;
  uint exFunctionsSize;
  
  local_58 = (ExternTypeInfo *)
             CONCAT44(local_58._4_4_,(int)CONCAT71(in_register_00000009,withVariables));
  exFunctionsSize = 0;
  pEVar6 = nullcDebugFunctionInfo(&exFunctionsSize);
  local_50 = nullcDebugSymbols((uint *)0x0);
  exModulesSize = 0;
  local_40 = nullcDebugModuleInfo(&exModulesSize);
  exInfoSize = 0;
  pEVar7 = nullcDebugSourceInfo(&exInfoSize);
  pcVar8 = nullcDebugSource();
  if ((ulong)exFunctionsSize == 0) {
    iVar5 = -1;
  }
  else {
    piVar13 = &pEVar6->regVmCodeSize;
    uVar22 = 0xffffffff;
    uVar15 = 0;
    do {
      if ((piVar13[-1] <= address) && (address < piVar13[-1] + *piVar13)) {
        uVar22 = uVar15 & 0xffffffff;
      }
      iVar5 = (int)uVar22;
      uVar15 = uVar15 + 1;
      piVar13 = piVar13 + 0x25;
    } while (exFunctionsSize != uVar15);
  }
  if (iVar5 == -1) {
    pcVar14 = "global scope";
    if (address == -1) {
      pcVar14 = "external";
    }
  }
  else {
    pcVar14 = local_50 + pEVar6[iVar5].offsetToName;
  }
  local_60 = pEVar6;
  iVar3 = NULLC::SafeSprintf(current,(ulong)bufSize,"%s",pcVar14);
  pcVar14 = current + iVar3;
  if (address != -1) {
    uVar15 = 0xffffffff;
    lVar20 = 0;
    do {
      if ((ulong)(exInfoSize - 1) * 0xc == lVar20) {
        uVar15 = (ulong)(exInfoSize - 1);
        break;
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      puVar18 = (uint *)((long)&pEVar7[1].instruction + lVar20);
      lVar20 = lVar20 + 0xc;
    } while (*puVar18 <= address - 1U);
    uVar15 = (ulong)pEVar7[uVar15].sourceOffset;
    do {
      uVar22 = uVar15;
      pcVar21 = pcVar8;
      if (uVar22 == 0) goto LAB_0024c1c4;
      uVar15 = uVar22 - 1;
    } while (pcVar8[uVar22 - 1] != '\n');
    pcVar21 = pcVar8 + uVar22;
LAB_0024c1c4:
    for (; (*pcVar21 == '\t' || (*pcVar21 == ' ')); pcVar21 = pcVar21 + 1) {
    }
    uVar19 = 0;
    if (exModulesSize == 0) {
      uVar4 = 0xffffffff;
      pcVar17 = (char *)0x0;
    }
    else {
      puVar18 = &local_40->sourceSize;
      uVar4 = 0xffffffff;
      pcVar17 = (char *)0x0;
      do {
        pcVar16 = pcVar8 + puVar18[-1];
        if (((pcVar21 < pcVar16) && (pcVar17 <= pcVar21)) && (pcVar17 < pcVar16)) break;
        if ((pcVar16 <= pcVar21) && (pcVar21 < pcVar16 + *puVar18)) {
          uVar4 = uVar19;
        }
        pcVar17 = pcVar16 + *puVar18;
        uVar19 = uVar19 + 1;
        puVar18 = puVar18 + 7;
      } while (exModulesSize != uVar19);
    }
    if (uVar4 != 0xffffffff) {
      pcVar17 = pcVar8 + local_40[uVar4].sourceOffset;
    }
    uVar15 = 1;
    if (pcVar17 < pcVar21) {
      iVar12 = 0;
      do {
        cVar1 = *pcVar17;
        pcVar17 = pcVar17 + 1;
        iVar12 = iVar12 + (uint)(cVar1 == '\n');
      } while (pcVar17 < pcVar21);
      uVar15 = (ulong)(iVar12 + 1);
    }
    lVar20 = 0;
    while ((0xd < (byte)pcVar21[lVar20] || ((0x2401U >> ((byte)pcVar21[lVar20] & 0x1f) & 1) == 0)))
    {
      lVar20 = lVar20 + 1;
    }
    iVar3 = NULLC::SafeSprintf(pcVar14,(ulong)(bufSize - iVar3)," (line %d: at %.*s)\r\n",uVar15);
    pcVar14 = pcVar14 + iVar3;
  }
  iVar3 = (int)current;
  if ((char)local_58 != '\0') {
    exTypesSize = 0;
    pEVar9 = nullcDebugTypeInfo(&exTypesSize);
    if (iVar5 == -1) {
      exLocalsSize = 0;
      pEVar11 = nullcDebugVariableInfo(&exLocalsSize);
      pcVar8 = local_50;
      if (exLocalsSize != 0) {
        puVar18 = &pEVar11->offset;
        uVar15 = 0;
        do {
          iVar5 = NULLC::SafeSprintf(pcVar14,(ulong)((iVar3 - (int)pcVar14) + bufSize),
                                     " %s %d: %s %s (at %d size %d)\r\n","global",
                                     uVar15 & 0xffffffff,pcVar8 + pEVar9[puVar18[-1]].offsetToName,
                                     pcVar8 + ((ExternVarInfo *)(puVar18 + -3))->offsetToName,
                                     (ulong)*puVar18,(ulong)pEVar9[puVar18[-1]].size);
          pcVar14 = pcVar14 + iVar5;
          uVar15 = uVar15 + 1;
          puVar18 = puVar18 + 4;
        } while (uVar15 < exLocalsSize);
      }
    }
    else {
      exLocalsSize = 0;
      pEVar10 = nullcDebugLocalInfo(&exLocalsSize);
      if (local_60[iVar5].externCount + local_60[iVar5].localCount != 0) {
        local_60 = local_60 + iVar5;
        uVar19 = 0;
        local_58 = pEVar9;
        do {
          uVar4 = local_60->offsetToFirstLocal + uVar19;
          bVar2 = pEVar10[uVar4].paramType;
          pcVar8 = "local";
          if (bVar2 == 2) {
            pcVar8 = "extern";
          }
          if (bVar2 == 0) {
            pcVar8 = "param";
          }
          pcVar21 = "base";
          if ((1 < bVar2) && (pcVar21 = "local", -1 < (int)pEVar10[uVar4].closeListID)) {
            pcVar21 = "closure";
          }
          iVar5 = NULLC::SafeSprintf(pcVar14,(ulong)((iVar3 - (int)pcVar14) + bufSize),
                                     " %s %d: %s %s (at %s+%d size %d)\r\n",pcVar8,(ulong)uVar19,
                                     local_50 + local_58[pEVar10[uVar4].type].offsetToName,
                                     local_50 + pEVar10[uVar4].offsetToName,pcVar21,
                                     (ulong)pEVar10[uVar4].offset,
                                     (ulong)local_58[pEVar10[uVar4].type].size);
          pcVar14 = pcVar14 + iVar5;
          uVar19 = uVar19 + 1;
        } while (uVar19 < local_60->externCount + local_60->localCount);
      }
    }
  }
  return (int)pcVar14 - iVar3;
}

Assistant:

unsigned int PrintStackFrame(int address, char* current, unsigned int bufSize, bool withVariables)
{
	const char *start = current;

	unsigned exFunctionsSize = 0;
	ExternFuncInfo *exFunctions = nullcDebugFunctionInfo(&exFunctionsSize);

	char *exSymbols = nullcDebugSymbols(NULL);

	unsigned exModulesSize = 0;
	ExternModuleInfo *exModules = nullcDebugModuleInfo(&exModulesSize);

	unsigned exInfoSize = 0;
	ExternSourceInfo *exInfo = nullcDebugSourceInfo(&exInfoSize);

	char *source = nullcDebugSource();

	int funcID = -1;
	for(unsigned int i = 0; i < exFunctionsSize; i++)
	{
		if(address >= exFunctions[i].regVmAddress && address < (exFunctions[i].regVmAddress + exFunctions[i].regVmCodeSize))
			funcID = i;
	}

	if(funcID != -1)
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), "%s", &exSymbols[exFunctions[funcID].offsetToName]);
	else
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), "%s", address == -1 ? "external" : "global scope");

	if(address != -1)
	{
		unsigned int infoID = 0;
		unsigned int i = address - 1;
		while((infoID < exInfoSize - 1) && (i >= exInfo[infoID + 1].instruction))
			infoID++;
		const char *codeStart = source + exInfo[infoID].sourceOffset;

		// Find beginning of the line
		while(codeStart != source && *(codeStart-1) != '\n')
			codeStart--;

		// Skip whitespace
		while(*codeStart == ' ' || *codeStart == '\t')
			codeStart++;
		const char *codeEnd = codeStart;

		// Find corresponding module
		unsigned moduleID = ~0u;
		const char *prevEnd = NULL;
		for(unsigned l = 0; l < exModulesSize; l++)
		{
			// special check for main module
			if(source + exModules[l].sourceOffset > prevEnd && codeStart >= prevEnd && codeStart < source + exModules[l].sourceOffset)
				break;
			if(codeStart >= source + exModules[l].sourceOffset && codeStart < source + exModules[l].sourceOffset + exModules[l].sourceSize)
				moduleID = l;
			prevEnd = source + exModules[l].sourceOffset + exModules[l].sourceSize;
		}
		const char *moduleStart = NULL;
		if(moduleID != ~0u)
			moduleStart = source + exModules[moduleID].sourceOffset;
		else
			moduleStart = prevEnd;

		// Find line number
		unsigned line = 0;
		while(moduleStart < codeStart)
		{
			if(*moduleStart++ == '\n')
				line++;
		}

		// Find ending of the line
		while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
			codeEnd++;

		int codeLength = (int)(codeEnd - codeStart);
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), " (line %d: at %.*s)\r\n", line + 1, codeLength, codeStart);
	}

	if(withVariables)
	{
		unsigned exTypesSize = 0;
		ExternTypeInfo *exTypes = nullcDebugTypeInfo(&exTypesSize);

		if(funcID != -1)
		{
			unsigned exLocalsSize = 0;
			ExternLocalInfo *exLocals = nullcDebugLocalInfo(&exLocalsSize);

			for(unsigned int i = 0; i < exFunctions[funcID].localCount + exFunctions[funcID].externCount; i++)
			{
				ExternLocalInfo &lInfo = exLocals[exFunctions[funcID].offsetToFirstLocal + i];
				const char *typeName = &exSymbols[exTypes[lInfo.type].offsetToName];
				const char *localName = &exSymbols[lInfo.offsetToName];
				const char *localType = lInfo.paramType == ExternLocalInfo::PARAMETER ? "param" : (lInfo.paramType == ExternLocalInfo::EXTERNAL ? "extern" : "local");
				const char *offsetType = (lInfo.paramType == ExternLocalInfo::PARAMETER || lInfo.paramType == ExternLocalInfo::LOCAL) ? "base" : (lInfo.closeListID & 0x80000000 ? "local" : "closure");
				current += NULLC::SafeSprintf(current, bufSize - int(current - start), " %s %d: %s %s (at %s+%d size %d)\r\n",	localType, i, typeName, localName, offsetType, lInfo.offset, exTypes[lInfo.type].size);
			}
		}
		else
		{
			unsigned exVariablesSize = 0;
			ExternVarInfo *exVariables = nullcDebugVariableInfo(&exVariablesSize);

			for(unsigned i = 0; i < exVariablesSize; i++)
			{
				ExternVarInfo &vInfo = exVariables[i];

				const char *typeName = &exSymbols[exTypes[vInfo.type].offsetToName];
				const char *localName = &exSymbols[vInfo.offsetToName];
				const char *localType = "global";
				current += NULLC::SafeSprintf(current, bufSize - int(current - start), " %s %d: %s %s (at %d size %d)\r\n", localType, i, typeName, localName, vInfo.offset, exTypes[vInfo.type].size);
			}
		}
	}

	return (unsigned int)(current - start);
}